

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O3

void OpenSteer::
     PointToPathAlikeMapping<OpenSteer::PolylineSegmentedPath,_OpenSteer::PointToPathMapping,_OpenSteer::PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPath>_>
     ::map(PolylineSegmentedPath *pathAlike,Vec3 *queryPoint,PointToPathMapping *mapping)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float segmentDistance;
  float local_58;
  undefined4 local_54;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  
  iVar1 = (*(pathAlike->super_SegmentedPath).super_Path._vptr_Path[10])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    local_58 = 3.4028235e+38;
    lVar2 = 0;
    do {
      local_54 = 0;
      local_40 = 0;
      local_38 = 0.0;
      local_50 = 0;
      local_48 = 0.0;
      (*(pathAlike->super_SegmentedPath).super_Path._vptr_Path[0x12])
                (pathAlike,lVar2,queryPoint,&local_54,&local_40,&local_50);
      fVar3 = queryPoint->x - (float)local_40;
      fVar4 = queryPoint->y - (float)((ulong)local_40 >> 0x20);
      fVar5 = queryPoint->z - local_38;
      fVar3 = SQRT(fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4);
      if (fVar3 < local_58) {
        (mapping->pointOnPathCenterLine).x = (float)(undefined4)local_40;
        (mapping->pointOnPathCenterLine).y = (float)local_40._4_4_;
        (mapping->pointOnPathCenterLine).z = local_38;
        (mapping->tangent).x = (float)(undefined4)local_50;
        (mapping->tangent).y = (float)local_50._4_4_;
        (mapping->tangent).z = local_48;
        mapping->distancePointToPath = fVar3;
        local_58 = fVar3;
      }
      (*(pathAlike->super_SegmentedPath).super_Path._vptr_Path[0xb])(pathAlike,lVar2);
      lVar2 = lVar2 + 1;
    } while (CONCAT44(extraout_var,iVar1) != lVar2);
  }
  return;
}

Assistant:

static void map( PathAlike const& pathAlike, Vec3 const& queryPoint, Mapping& mapping ) {
            float minDistancePointToPath = std::numeric_limits< float >::max();
            mapping.setDistanceOnPathFlag( 0.0f );
            
            typedef typename PathAlike::size_type size_type;
            size_type const segmentCount = pathAlike.segmentCount();
            for ( size_type segmentIndex = 0; segmentIndex < segmentCount; ++segmentIndex ) {
                
                float segmentDistance = 0.0f;
                float radius = 0.0f;
                float distancePointToPath = 0.0f;
                Vec3 pointOnPathCenterLine( 0.0f, 0.0f, 0.0f );
                Vec3 tangent( 0.0f, 0.0f, 0.0f );
                
                BaseDataExtractionPolicy::extract( pathAlike, segmentIndex, queryPoint, segmentDistance, radius, distancePointToPath, pointOnPathCenterLine, tangent );
                
                if ( distancePointToPath < minDistancePointToPath ) {
                    minDistancePointToPath = distancePointToPath;
                    mapping.setPointOnPathCenterLine( pointOnPathCenterLine );
                    mapping.setPointOnPathBoundary( pointOnPathCenterLine + ( ( queryPoint - pointOnPathCenterLine ).normalize() * radius ) );
                    mapping.setRadius( radius );
                    mapping.setTangent( tangent );
                    mapping.setSegmentIndex( segmentIndex );
                    mapping.setDistancePointToPath( distancePointToPath );
                    mapping.setDistancePointToPathCenterLine( distancePointToPath + radius );
                    mapping.setDistanceOnPath( mapping.distanceOnPathFlag() + segmentDistance );
                    mapping.setDistanceOnSegment( segmentDistance );
                }
                
                mapping.setDistanceOnPathFlag( mapping.distanceOnPathFlag() + pathAlike.segmentLength( segmentIndex ) );
            }
        }